

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_test.cc
# Opt level: O2

void __thiscall leveldb::_Test_ReopenAppendableFile::_Run(_Test_ReopenAppendableFile *this)

{
  Env *pEVar1;
  WritableFile *appendable_file;
  string data;
  string test_file_name;
  string test_dir;
  Status SStack_248;
  long *local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  string local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  Status local_1d8;
  Status local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  Tester local_1a8;
  
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  local_1c8._M_string_length = 0;
  local_1c8.field_2._M_local_buf[0] = '\0';
  test::Tester::Tester
            (&local_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/env_test.cc"
             ,0xc9);
  pEVar1 = (this->super_EnvTest).env_;
  (*pEVar1->_vptr_Env[0x11])(&local_1f8,pEVar1,&local_1c8);
  test::Tester::IsOk(&local_1a8,(Status *)&local_1f8);
  Status::~Status((Status *)&local_1f8);
  test::Tester::~Tester(&local_1a8);
  std::operator+(&local_1f8,&local_1c8,"/reopen_appendable_file.txt");
  pEVar1 = (this->super_EnvTest).env_;
  (*pEVar1->_vptr_Env[8])(&local_1d0,pEVar1,&local_1f8);
  Status::~Status(&local_1d0);
  test::Tester::Tester
            (&local_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/env_test.cc"
             ,0xce);
  pEVar1 = (this->super_EnvTest).env_;
  (*pEVar1->_vptr_Env[5])(&local_218,pEVar1,&local_1f8,&local_240);
  test::Tester::IsOk(&local_1a8,(Status *)&local_218);
  Status::~Status((Status *)&local_218);
  test::Tester::~Tester(&local_1a8);
  std::__cxx11::string::string((string *)&local_218,"hello world!",(allocator *)&local_1a8);
  test::Tester::Tester
            (&local_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/env_test.cc"
             ,0xd0);
  local_238._M_dataplus._M_p._0_4_ = local_218._M_dataplus._M_p._0_4_;
  local_238._M_dataplus._M_p._4_4_ = local_218._M_dataplus._M_p._4_4_;
  local_238._M_string_length._0_4_ = (undefined4)local_218._M_string_length;
  local_238._M_string_length._4_4_ = local_218._M_string_length._4_4_;
  (**(code **)(*local_240 + 0x10))(&SStack_248);
  test::Tester::IsOk(&local_1a8,&SStack_248);
  Status::~Status(&SStack_248);
  test::Tester::~Tester(&local_1a8);
  test::Tester::Tester
            (&local_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/env_test.cc"
             ,0xd1);
  (**(code **)(*local_240 + 0x18))(&local_238);
  test::Tester::IsOk(&local_1a8,(Status *)&local_238);
  Status::~Status((Status *)&local_238);
  test::Tester::~Tester(&local_1a8);
  if (local_240 != (long *)0x0) {
    (**(code **)(*local_240 + 8))();
  }
  test::Tester::Tester
            (&local_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/env_test.cc"
             ,0xd4);
  pEVar1 = (this->super_EnvTest).env_;
  (*pEVar1->_vptr_Env[5])(&local_238,pEVar1,&local_1f8,&local_240);
  test::Tester::IsOk(&local_1a8,(Status *)&local_238);
  Status::~Status((Status *)&local_238);
  test::Tester::~Tester(&local_1a8);
  std::__cxx11::string::assign((char *)&local_218);
  test::Tester::Tester
            (&local_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/env_test.cc"
             ,0xd6);
  local_238._M_dataplus._M_p._0_4_ = local_218._M_dataplus._M_p._0_4_;
  local_238._M_dataplus._M_p._4_4_ = local_218._M_dataplus._M_p._4_4_;
  local_238._M_string_length._0_4_ = (undefined4)local_218._M_string_length;
  local_238._M_string_length._4_4_ = local_218._M_string_length._4_4_;
  (**(code **)(*local_240 + 0x10))(&SStack_248);
  test::Tester::IsOk(&local_1a8,&SStack_248);
  Status::~Status(&SStack_248);
  test::Tester::~Tester(&local_1a8);
  test::Tester::Tester
            (&local_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/env_test.cc"
             ,0xd7);
  (**(code **)(*local_240 + 0x18))(&local_238);
  test::Tester::IsOk(&local_1a8,(Status *)&local_238);
  Status::~Status((Status *)&local_238);
  test::Tester::~Tester(&local_1a8);
  if (local_240 != (long *)0x0) {
    (**(code **)(*local_240 + 8))();
  }
  test::Tester::Tester
            (&local_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/env_test.cc"
             ,0xda);
  ReadFileToString((leveldb *)&local_238,(this->super_EnvTest).env_,&local_1f8,&local_218);
  test::Tester::IsOk(&local_1a8,(Status *)&local_238);
  Status::~Status((Status *)&local_238);
  test::Tester::~Tester(&local_1a8);
  test::Tester::Tester
            (&local_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/env_test.cc"
             ,0xdb);
  std::__cxx11::string::string((string *)&local_238,"hello world!42",(allocator *)&SStack_248);
  test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>(&local_1a8,&local_238,&local_218);
  std::__cxx11::string::~string((string *)&local_238);
  test::Tester::~Tester(&local_1a8);
  pEVar1 = (this->super_EnvTest).env_;
  (*pEVar1->_vptr_Env[8])(&local_1d8,pEVar1,&local_1f8);
  Status::~Status(&local_1d8);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1c8);
  return;
}

Assistant:

TEST(EnvTest, ReopenAppendableFile) {
  std::string test_dir;
  ASSERT_OK(env_->GetTestDirectory(&test_dir));
  std::string test_file_name = test_dir + "/reopen_appendable_file.txt";
  env_->DeleteFile(test_file_name);

  WritableFile* appendable_file;
  ASSERT_OK(env_->NewAppendableFile(test_file_name, &appendable_file));
  std::string data("hello world!");
  ASSERT_OK(appendable_file->Append(data));
  ASSERT_OK(appendable_file->Close());
  delete appendable_file;

  ASSERT_OK(env_->NewAppendableFile(test_file_name, &appendable_file));
  data = "42";
  ASSERT_OK(appendable_file->Append(data));
  ASSERT_OK(appendable_file->Close());
  delete appendable_file;

  ASSERT_OK(ReadFileToString(env_, test_file_name, &data));
  ASSERT_EQ(std::string("hello world!42"), data);
  env_->DeleteFile(test_file_name);
}